

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::SharedPtr
          (SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *this,
          TopLevelObject *ptr)

{
  TopLevelObject *pTVar1;
  SharedPtrState<vkt::tessellation::(anonymous_namespace)::TopLevelObject,_de::DefaultDeleter<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>
  *pSVar2;
  DefaultDeleter<vkt::tessellation::(anonymous_namespace)::TopLevelObject> local_25 [13];
  TopLevelObject *local_18;
  TopLevelObject *ptr_local;
  SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject> *this_local;
  
  this->m_ptr = (TopLevelObject *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (TopLevelObject *)this;
  pSVar2 = (SharedPtrState<vkt::tessellation::(anonymous_namespace)::TopLevelObject,_de::DefaultDeleter<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>
            *)operator_new(0x20);
  pTVar1 = local_18;
  DefaultDeleter<vkt::tessellation::(anonymous_namespace)::TopLevelObject>::DefaultDeleter(local_25)
  ;
  SharedPtrState<vkt::tessellation::(anonymous_namespace)::TopLevelObject,_de::DefaultDeleter<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>
  ::SharedPtrState(pSVar2,pTVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}